

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaItemListAddSize(xmlSchemaItemListPtr list,int initialSize,void *item)

{
  int iVar1;
  void **ppvVar2;
  void *item_local;
  int initialSize_local;
  xmlSchemaItemListPtr list_local;
  
  if (list->items == (void **)0x0) {
    item_local._4_4_ = initialSize;
    if (initialSize < 1) {
      item_local._4_4_ = 1;
    }
    ppvVar2 = (void **)(*xmlMalloc)((long)item_local._4_4_ << 3);
    list->items = ppvVar2;
    if (list->items == (void **)0x0) {
      xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0,"allocating new item list",(xmlNodePtr)0x0);
      return -1;
    }
    list->sizeItems = item_local._4_4_;
  }
  else if (list->sizeItems <= list->nbItems) {
    list->sizeItems = list->sizeItems << 1;
    ppvVar2 = (void **)(*xmlRealloc)(list->items,(long)list->sizeItems << 3);
    list->items = ppvVar2;
    if (list->items == (void **)0x0) {
      xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0,"growing item list",(xmlNodePtr)0x0);
      list->sizeItems = 0;
      return -1;
    }
  }
  iVar1 = list->nbItems;
  list->nbItems = iVar1 + 1;
  list->items[iVar1] = item;
  return 0;
}

Assistant:

static int
xmlSchemaItemListAddSize(xmlSchemaItemListPtr list,
			 int initialSize,
			 void *item)
{
    if (list->items == NULL) {
	if (initialSize <= 0)
	    initialSize = 1;
	list->items = (void **) xmlMalloc(
	    initialSize * sizeof(void *));
	if (list->items == NULL) {
	    xmlSchemaPErrMemory(NULL, "allocating new item list", NULL);
	    return(-1);
	}
	list->sizeItems = initialSize;
    } else if (list->sizeItems <= list->nbItems) {
	list->sizeItems *= 2;
	list->items = (void **) xmlRealloc(list->items,
	    list->sizeItems * sizeof(void *));
	if (list->items == NULL) {
	    xmlSchemaPErrMemory(NULL, "growing item list", NULL);
	    list->sizeItems = 0;
	    return(-1);
	}
    }
    list->items[list->nbItems++] = item;
    return(0);
}